

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O1

void pce_defpal(int *ip)

{
  char cVar1;
  int iVar2;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 2;
  data_level = 3;
  do {
    iVar2 = evaluate(ip,'\0');
    if (iVar2 == 0) {
      return;
    }
    if (pass == 1) {
      putword(loccnt,(value >> 5 & 0x38 | value & 7) + (value & 0x70) * 4);
    }
    loccnt = loccnt + 2;
    iVar2 = *ip;
    *ip = iVar2 + 1;
    cVar1 = prlnbuf[iVar2];
  } while (cVar1 == ',');
  if (pass == 1) {
    println();
  }
  if ((cVar1 != '\0') && (cVar1 != ';')) {
    error("Syntax error!");
    return;
  }
  return;
}

Assistant:

void
pce_defpal(int *ip)
{
	unsigned int color;
	unsigned int r, g, b;
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 2;
	data_level  = 3;

	/* get data */
	for (;;) {
		/* get color */
		if (!evaluate(ip, 0))
			return;

		/* store data on last pass */
		if (pass == LAST_PASS) {
			/* convert color */
			r = (value >> 8) & 0x7;
			g = (value >> 4) & 0x7;
			b = (value) & 0x7;
			color = (g << 6) + (r << 3) + (b);

			/* store color */
			putword(loccnt, color);
		}

		/* update location counter */
		loccnt += 2;

		/* check if there's another color */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* output line */
	if (pass == LAST_PASS)
		println();

	/* check errors */
	if (c != ';' && c != '\0')
		error("Syntax error!");
}